

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,REF_BOOL *manifold)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  uint uVar2;
  REF_BOOL RVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  REF_BOOL contains;
  REF_INT cell;
  REF_INT nodes [27];
  uint local_c4;
  int local_c0;
  int local_bc;
  REF_BOOL *local_b8;
  REF_CELL local_b0;
  int local_a8;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  
  *manifold = 0;
  iVar4 = ref_cavity->surf_node;
  if (iVar4 == -1) {
    iVar4 = ref_cavity->node;
  }
  local_b8 = manifold;
  if (0 < ref_cavity->maxseg) {
    ref_cell = ref_cavity->ref_grid->cell[3];
    lVar6 = 8;
    lVar5 = 0;
    do {
      pRVar1 = ref_cavity->s2n;
      local_a8 = *(int *)((long)pRVar1 + lVar6 + -8);
      if ((iVar4 != local_a8 && local_a8 != -1) && (iVar4 != *(int *)((long)pRVar1 + lVar6 + -4))) {
        local_a4 = *(undefined4 *)((long)pRVar1 + lVar6 + -4);
        local_9c = *(undefined4 *)((long)pRVar1 + lVar6);
        local_a0 = iVar4;
        uVar2 = ref_cell_with(ref_cell,&local_a8,&local_bc);
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x6ae,"ref_cavity_manifold",(ulong)uVar2,"with manifold search failed");
          local_c4 = uVar2;
        }
        if ((uVar2 != 5) && (uVar2 != 0)) {
          return local_c4;
        }
        if (local_bc != -1) {
          uVar2 = ref_list_contains(ref_cavity->tri_list,local_bc,&local_c0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x6b1,"ref_cavity_manifold",(ulong)uVar2,"contains a plan to remove");
            return uVar2;
          }
          if (local_c0 == 0) goto LAB_0015cb29;
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0xc;
    } while (lVar5 < ref_cavity->maxseg);
  }
  RVar3 = 1;
  if (0 < ref_cavity->maxface) {
    iVar4 = ref_cavity->node;
    local_b0 = ref_cavity->ref_grid->cell[8];
    lVar5 = 8;
    lVar6 = 0;
    do {
      pRVar1 = ref_cavity->f2n;
      local_a8 = *(int *)((long)pRVar1 + lVar5 + -8);
      if (((iVar4 != local_a8 && local_a8 != -1) && (iVar4 != *(int *)((long)pRVar1 + lVar5 + -4)))
         && (iVar4 != *(int *)((long)pRVar1 + lVar5))) {
        local_a4 = *(undefined4 *)((long)pRVar1 + lVar5 + -4);
        local_a0 = *(undefined4 *)((long)pRVar1 + lVar5);
        local_9c = iVar4;
        uVar2 = ref_cell_with(local_b0,&local_a8,&local_bc);
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x6c8,"ref_cavity_manifold",(ulong)uVar2,"with manifold search failed");
          local_c4 = uVar2;
        }
        if ((uVar2 != 5) && (uVar2 != 0)) {
          return local_c4;
        }
        if (local_bc != -1) {
          uVar2 = ref_list_contains(ref_cavity->tet_list,local_bc,&local_c0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x6cb,"ref_cavity_manifold",(ulong)uVar2,"contains a plan to remove");
            return uVar2;
          }
          if (local_c0 == 0) goto LAB_0015cb29;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar6 < ref_cavity->maxface);
    RVar3 = 1;
  }
LAB_0015cb03:
  *local_b8 = RVar3;
  return 0;
LAB_0015cb29:
  RVar3 = 0;
  goto LAB_0015cb03;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,
                                              REF_BOOL *manifold) {
  REF_INT node;
  REF_CELL ref_cell;
  REF_INT seg, face;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL contains;

  *manifold = REF_FALSE;

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    /* skip a seg attached to node */
    if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
        node == ref_cavity_s2n(ref_cavity, 1, seg))
      continue;

    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    /* skip a face attached to node */
    if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
        node == ref_cavity_f2n(ref_cavity, 1, face) ||
        node == ref_cavity_f2n(ref_cavity, 2, face))
      continue;

    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  *manifold = REF_TRUE;

  return REF_SUCCESS;
}